

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O2

void __thiscall
duckdb::WindowPartitionGlobalSinkState::OnSortedPartition
          (WindowPartitionGlobalSinkState *this,idx_t group_idx)

{
  __uniq_ptr_impl<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>_> __p;
  __uniq_ptr_impl<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>_> *this_00;
  __uniq_ptr_impl<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>_> local_20;
  size_type local_18;
  
  local_18 = group_idx;
  make_uniq<duckdb::WindowHashGroup,duckdb::WindowGlobalSinkState&,unsigned_long_const&>
            ((duckdb *)&local_20,this->gsink,&local_18);
  this_00 = (__uniq_ptr_impl<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>_>
             *)vector<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>,_true>
               ::get<true>(&this->window_hash_groups,local_18);
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowHashGroup_*,_std::default_delete<duckdb::WindowHashGroup>_>.
  super__Head_base<0UL,_duckdb::WindowHashGroup_*,_false>._M_head_impl =
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowHashGroup_*,_std::default_delete<duckdb::WindowHashGroup>_>
       .super__Head_base<0UL,_duckdb::WindowHashGroup_*,_false>._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowHashGroup_*,_std::default_delete<duckdb::WindowHashGroup>_>.
  super__Head_base<0UL,_duckdb::WindowHashGroup_*,_false>._M_head_impl =
       (tuple<duckdb::WindowHashGroup_*,_std::default_delete<duckdb::WindowHashGroup>_>)
       (_Tuple_impl<0UL,_duckdb::WindowHashGroup_*,_std::default_delete<duckdb::WindowHashGroup>_>)
       0x0;
  ::std::__uniq_ptr_impl<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>_>::
  reset(this_00,(pointer)__p._M_t.
                         super__Tuple_impl<0UL,_duckdb::WindowHashGroup_*,_std::default_delete<duckdb::WindowHashGroup>_>
                         .super__Head_base<0UL,_duckdb::WindowHashGroup_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>_>::
  ~unique_ptr((unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>_> *)
              &local_20);
  return;
}

Assistant:

void OnSortedPartition(const idx_t group_idx) override {
		PartitionGlobalSinkState::OnSortedPartition(group_idx);
		window_hash_groups[group_idx] = make_uniq<WindowHashGroup>(gsink, group_idx);
	}